

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pragma.cpp
# Opt level: O2

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformPragma(Transformer *this,PGPragmaStmt *stmt)

{
  string *__k;
  int iVar1;
  bool bVar2;
  pointer pPVar3;
  type pPVar4;
  pointer pPVar5;
  BaseExpression *pBVar6;
  ComparisonExpression *pCVar7;
  ColumnRefExpression *pCVar8;
  string *psVar9;
  InternalException *pIVar10;
  iterator iVar11;
  reference args_1;
  ParserException *pPVar12;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  long lVar13;
  undefined1 local_120 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  *local_f0;
  _Head_base<0UL,_duckdb::PragmaStatement_*,_false> local_e8;
  case_insensitive_set_t sqlite_compat_pragmas;
  string local_70;
  string local_50;
  
  make_uniq<duckdb::PragmaStatement>();
  pPVar3 = unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>::
           operator->((unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
                       *)&local_e8);
  pPVar4 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator*
                     (&pPVar3->info);
  __k = &pPVar4->name;
  ::std::__cxx11::string::assign((char *)__k);
  lVar13 = *(long *)(in_RDX + 0x10);
  if (lVar13 != 0) {
    local_f0 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pPVar4->parameters;
    while (lVar13 = *(long *)(lVar13 + 8), lVar13 != 0) {
      TransformExpression((Transformer *)local_120,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)local_120);
      if ((pPVar5->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
        pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)local_120)->super_BaseExpression;
        pCVar7 = BaseExpression::Cast<duckdb::ComparisonExpression>(pBVar6);
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&pCVar7->left);
        if ((pPVar5->super_BaseExpression).type != COLUMN_REF) {
          pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&sqlite_compat_pragmas,
                     "Named parameter requires a column reference on the LHS",
                     (allocator *)(local_120 + 0x10));
          ParserException::ParserException(pPVar12,(string *)&sqlite_compat_pragmas);
          __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(&pCVar7->left)->super_BaseExpression;
        pCVar8 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar6);
        __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_120 + 0x10);
        (*(pCVar8->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])(__x,pCVar8)
        ;
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
                    *)&sqlite_compat_pragmas,__x,&pCVar7->right);
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&pPVar4->named_parameters,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
                    *)&sqlite_compat_pragmas);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
                 *)&sqlite_compat_pragmas);
LAB_013637eb:
        ::std::__cxx11::string::~string((string *)__x);
      }
      else {
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)local_120);
        if ((pPVar5->super_BaseExpression).type == COLUMN_REF) {
          pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)local_120)->super_BaseExpression;
          pCVar8 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar6);
          bVar2 = ColumnRefExpression::IsQualified(pCVar8);
          if (bVar2) {
            pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)local_120);
            (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_70,pPVar5);
            Value::Value((Value *)&sqlite_compat_pragmas,&local_70);
            make_uniq<duckdb::ConstantExpression,duckdb::Value>
                      ((duckdb *)(local_120 + 0x10),(Value *)&sqlite_compat_pragmas);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      (local_f0,(unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                                 *)(local_120 + 0x10));
            if ((Transformer *)local_110._M_dataplus._M_p != (Transformer *)0x0) {
              (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_110._M_dataplus._M_p)->ptr
                        ->options)();
            }
            local_110._M_dataplus._M_p = (pointer)0x0;
            Value::~Value((Value *)&sqlite_compat_pragmas);
            __x = &local_70;
          }
          else {
            psVar9 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar8);
            ::std::__cxx11::string::string((string *)&local_50,(string *)psVar9);
            Value::Value((Value *)&sqlite_compat_pragmas,&local_50);
            make_uniq<duckdb::ConstantExpression,duckdb::Value>
                      ((duckdb *)(local_120 + 0x10),(Value *)&sqlite_compat_pragmas);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      (local_f0,(unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                                 *)(local_120 + 0x10));
            if ((Transformer *)local_110._M_dataplus._M_p != (Transformer *)0x0) {
              (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_110._M_dataplus._M_p)->ptr
                        ->options)();
            }
            local_110._M_dataplus._M_p = (pointer)0x0;
            Value::~Value((Value *)&sqlite_compat_pragmas);
            __x = &local_50;
          }
          goto LAB_013637eb;
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  (local_f0,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)local_120);
      }
      if ((long *)CONCAT71(local_120._1_7_,local_120[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_120._1_7_,local_120[0]) + 8))();
      }
    }
  }
  iVar1 = *(int *)(in_RDX + 4);
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      if ((long)(pPVar4->parameters).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pPVar4->parameters).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&sqlite_compat_pragmas,
                   "PRAGMA statement with assignment should contain exactly one parameter",
                   (allocator *)(local_120 + 0x10));
        ParserException::ParserException(pPVar12,(string *)&sqlite_compat_pragmas);
        __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((pPVar4->named_parameters)._M_h._M_element_count != 0) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&sqlite_compat_pragmas,
                   "PRAGMA statement with assignment cannot have named parameters",
                   (allocator *)(local_120 + 0x10));
        InternalException::InternalException(pIVar10,(string *)&sqlite_compat_pragmas);
        __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string
                ((string *)(local_120 + 0x10),"table_info",(allocator *)local_120);
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&sqlite_compat_pragmas,local_120 + 0x10,&local_f0,0,local_120 + 0xf,
                 local_120 + 0xe,local_120 + 0xd);
      ::std::__cxx11::string::~string((string *)(local_120 + 0x10));
      iVar11 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&sqlite_compat_pragmas._M_h,__k);
      if (iVar11.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        args_1 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::get<true>(&pPVar4->parameters,0);
        local_120[0] = (allocator)0x0;
        make_uniq<duckdb::SetVariableStatement,std::__cxx11::string&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::SetScope>
                  ((duckdb *)(local_120 + 0x10),__k,args_1,local_120);
        (this->parent).ptr = (Transformer *)local_110._M_dataplus._M_p;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&sqlite_compat_pragmas._M_h);
        if ((Transformer *)local_e8._M_head_impl == (Transformer *)0x0) {
          return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
        }
        (*(code *)((Transformer *)((local_e8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)
                  ->options)();
        return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&sqlite_compat_pragmas._M_h);
    }
    else {
      if (iVar1 != 0) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&sqlite_compat_pragmas,"Unknown pragma type",
                   (allocator *)(local_120 + 0x10));
        InternalException::InternalException(pIVar10,(string *)&sqlite_compat_pragmas);
        __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (((pPVar4->parameters).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (pPVar4->parameters).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((pPVar4->named_parameters)._M_h._M_element_count != 0)) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&sqlite_compat_pragmas,
                   "PRAGMA statement that is not a call or assignment cannot contain parameters",
                   (allocator *)(local_120 + 0x10));
        InternalException::InternalException(pIVar10,(string *)&sqlite_compat_pragmas);
        __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  (this->parent).ptr = (Transformer *)local_e8._M_head_impl;
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformPragma(duckdb_libpgquery::PGPragmaStmt &stmt) {
	auto result = make_uniq<PragmaStatement>();
	auto &info = *result->info;

	info.name = stmt.name;
	// parse the arguments, if any
	if (stmt.args) {
		for (auto cell = stmt.args->head; cell != nullptr; cell = cell->next) {
			auto node = PGPointerCast<duckdb_libpgquery::PGNode>(cell->data.ptr_value);
			auto expr = TransformExpression(node);

			if (expr->GetExpressionType() == ExpressionType::COMPARE_EQUAL) {
				auto &comp = expr->Cast<ComparisonExpression>();
				if (comp.left->GetExpressionType() != ExpressionType::COLUMN_REF) {
					throw ParserException("Named parameter requires a column reference on the LHS");
				}
				auto &columnref = comp.left->Cast<ColumnRefExpression>();
				info.named_parameters.insert(make_pair(columnref.GetName(), std::move(comp.right)));
			} else if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (!colref.IsQualified()) {
					info.parameters.emplace_back(make_uniq<ConstantExpression>(Value(colref.GetColumnName())));
				} else {
					info.parameters.emplace_back(make_uniq<ConstantExpression>(Value(expr->ToString())));
				}
			} else {
				info.parameters.emplace_back(std::move(expr));
			}
		}
	}
	// now parse the pragma type
	switch (stmt.kind) {
	case duckdb_libpgquery::PG_PRAGMA_TYPE_NOTHING: {
		if (!info.parameters.empty() || !info.named_parameters.empty()) {
			throw InternalException("PRAGMA statement that is not a call or assignment cannot contain parameters");
		}
		break;
	case duckdb_libpgquery::PG_PRAGMA_TYPE_ASSIGNMENT:
		if (info.parameters.size() != 1) {
			throw ParserException("PRAGMA statement with assignment should contain exactly one parameter");
		}
		if (!info.named_parameters.empty()) {
			throw InternalException("PRAGMA statement with assignment cannot have named parameters");
		}
		// SQLite does not distinguish between:
		// "PRAGMA table_info='integers'"
		// "PRAGMA table_info('integers')"
		// for compatibility, any pragmas that match the SQLite ones are parsed as calls
		case_insensitive_set_t sqlite_compat_pragmas {"table_info"};
		if (sqlite_compat_pragmas.find(info.name) != sqlite_compat_pragmas.end()) {
			break;
		}
		auto set_statement =
		    make_uniq<SetVariableStatement>(info.name, std::move(info.parameters[0]), SetScope::AUTOMATIC);
		return std::move(set_statement);
	}
	case duckdb_libpgquery::PG_PRAGMA_TYPE_CALL:
		break;
	default:
		throw InternalException("Unknown pragma type");
	}

	return std::move(result);
}